

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_dir_and_check_ours.c
# Opt level: O0

char * make_dir_and_check_ours(char *dirname)

{
  __uid_t _Var1;
  __syscall_slong_t _Var2;
  int iVar3;
  __uid_t _Var4;
  int *piVar5;
  char *pcVar6;
  undefined1 local_a8 [8];
  stat st;
  char *dirname_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)dirname;
  iVar3 = mkdir(dirname,0x1c0);
  if ((iVar3 < 0) && (piVar5 = __errno_location(), _Var2 = st.__glibc_reserved[2], *piVar5 != 0x11))
  {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar6 = dupprintf("%s: mkdir: %s",_Var2,pcVar6);
    return pcVar6;
  }
  iVar3 = stat((char *)st.__glibc_reserved[2],(stat *)local_a8);
  _Var2 = st.__glibc_reserved[2];
  _Var1 = st.st_nlink._4_4_;
  if (iVar3 < 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    dirname_local = dupprintf("%s: stat: %s",_Var2,pcVar6);
  }
  else {
    _Var4 = getuid();
    if (_Var1 == _Var4) {
      if (((uint)st.st_nlink & 0x3f) == 0) {
        dirname_local = (char *)0x0;
      }
      else {
        dirname_local =
             dupprintf("%s: directory has overgenerous permissions %03o (expected 700)",
                       st.__glibc_reserved[2],(ulong)((uint)st.st_nlink & 0x1ff));
      }
    }
    else {
      dirname_local =
           dupprintf("%s: directory owned by uid %d, not by us",st.__glibc_reserved[2],
                     (ulong)st.st_nlink._4_4_);
    }
  }
  return dirname_local;
}

Assistant:

char *make_dir_and_check_ours(const char *dirname)
{
    struct stat st;

    /*
     * Create the directory. We might have created it before, so
     * EEXIST is an OK error; but anything else is doom.
     */
    if (mkdir(dirname, 0700) < 0 && errno != EEXIST)
        return dupprintf("%s: mkdir: %s", dirname, strerror(errno));

    /*
     * Stat the directory and check its ownership and permissions.
     */
    if (stat(dirname, &st) < 0)
        return dupprintf("%s: stat: %s", dirname, strerror(errno));
    if (st.st_uid != getuid())
        return dupprintf("%s: directory owned by uid %d, not by us",
                         dirname, st.st_uid);
    if ((st.st_mode & 077) != 0)
        return dupprintf("%s: directory has overgenerous permissions %03o"
                         " (expected 700)", dirname, st.st_mode & 0777);

    return NULL;
}